

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_alg.c
# Opt level: O2

c_float vec_scaled_norm_inf(c_float *S,c_float *v,c_int l)

{
  long lVar1;
  c_float cVar2;
  double dVar3;
  double dVar4;
  
  lVar1 = 0;
  if (l < 1) {
    l = lVar1;
  }
  cVar2 = 0.0;
  for (; l != lVar1; lVar1 = lVar1 + 1) {
    dVar3 = S[lVar1] * v[lVar1];
    dVar4 = -dVar3;
    if (-dVar3 <= dVar3) {
      dVar4 = dVar3;
    }
    if (dVar4 <= cVar2) {
      dVar4 = cVar2;
    }
    cVar2 = dVar4;
  }
  return cVar2;
}

Assistant:

c_float vec_scaled_norm_inf(const c_float *S, const c_float *v, c_int l) {
  c_int   i;
  c_float abs_Sv_i;
  c_float max = 0.0;

  for (i = 0; i < l; i++) {
    abs_Sv_i = c_absval(S[i] * v[i]);

    if (abs_Sv_i > max) max = abs_Sv_i;
  }
  return max;
}